

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_changed_ranges.c
# Opt level: O0

void ts_range_array_add(TSRangeArray *self,Length start,Length end)

{
  TSRange *pTVar1;
  uint uVar2;
  TSRange range;
  TSRange *last_range;
  TSRangeArray *self_local;
  uint local_30;
  Length end_local;
  uint local_14;
  Length start_local;
  
  local_14 = start.bytes;
  local_30 = end.bytes;
  if (self->size != 0) {
    if (self->size <= self->size - 1) {
      __assert_fail("(uint32_t)(self)->size - 1 < (self)->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/get_changed_ranges.c"
                    ,0xc,"void ts_range_array_add(TSRangeArray *, Length, Length)");
    }
    pTVar1 = self->contents;
    uVar2 = self->size - 1;
    if (local_14 <= pTVar1[uVar2].end_byte) {
      pTVar1[uVar2].end_byte = local_30;
      pTVar1[uVar2].end_point = end.extent;
      return;
    }
  }
  if (local_14 < local_30) {
    array__grow((VoidArray *)self,0x18);
    uVar2 = self->size;
    self->size = uVar2 + 1;
    pTVar1 = self->contents + uVar2;
    pTVar1->start_point = start.extent;
    pTVar1->end_point = end.extent;
    pTVar1->start_byte = local_14;
    pTVar1->end_byte = local_30;
  }
  return;
}

Assistant:

static void ts_range_array_add(TSRangeArray *self, Length start, Length end) {
  if (self->size > 0) {
    TSRange *last_range = array_back(self);
    if (start.bytes <= last_range->end_byte) {
      last_range->end_byte = end.bytes;
      last_range->end_point = end.extent;
      return;
    }
  }

  if (start.bytes < end.bytes) {
    TSRange range = { start.extent, end.extent, start.bytes, end.bytes };
    array_push(self, range);
  }
}